

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O1

int av1_get_pred_context_comp_ref_p1(MACROBLOCKD *xd)

{
  int iVar1;
  
  iVar1 = 1;
  if (xd->neighbors_ref_counts[1] != xd->neighbors_ref_counts[2]) {
    iVar1 = (uint)(xd->neighbors_ref_counts[2] <= xd->neighbors_ref_counts[1]) * 2;
  }
  return iVar1;
}

Assistant:

static int get_pred_context_last_or_last2(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of LAST
  const int last_count = ref_counts[LAST_FRAME];
  // Count of LAST2
  const int last2_count = ref_counts[LAST2_FRAME];

  const int pred_context =
      (last_count == last2_count) ? 1 : ((last_count < last2_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}